

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::computeDualfarkas4Col(SPxSolverBase<double> *this,double direction)

{
  double dVar1;
  int i_00;
  UpdateVector<double> *pUVar2;
  int i;
  long lVar3;
  double local_28;
  
  (this->dualFarkas).super_SVectorBase<double>.memused = 0;
  DSVectorBase<double>::setMax(&this->dualFarkas,(this->theCoPvec->thedelta).super_IdxSet.num);
  for (lVar3 = 0; pUVar2 = this->theCoPvec, lVar3 < (pUVar2->thedelta).super_IdxSet.num;
      lVar3 = lVar3 + 1) {
    i_00 = (pUVar2->thedelta).super_IdxSet.idx[lVar3];
    dVar1 = (pUVar2->thedelta).super_VectorBase<double>.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i_00];
    local_28 = (double)((ulong)-dVar1 & -(ulong)(0.0 < direction) |
                       ~-(ulong)(0.0 < direction) & (ulong)dVar1);
    DSVectorBase<double>::add(&this->dualFarkas,i_00,&local_28);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeDualfarkas4Col(R direction)
{
   R sign = (direction > 0 ? -1.0 : 1.0);

   dualFarkas.clear();
   dualFarkas.setMax(coPvec().delta().size());

   for(int i = 0; i < coPvec().delta().size(); ++i)
      dualFarkas.add(coPvec().delta().index(i), sign * coPvec().delta().value(i));
}